

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined8 uVar4;
  bool bVar5;
  float fVar6;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = center_x_ratio;
  pIVar3 = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.x;
  fVar2 = (pIVar3->WindowPadding).x;
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar6 = (float)((uint)bVar5 * (int)fVar2 + (uint)!bVar5 * (int)fVar1);
  fVar1 = (GImGui->LastItemData).Rect.Min.x - fVar6;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)((fVar6 + (GImGui->LastItemData).Rect.Max.x) - fVar1)),
                           auVar7._0_16_,ZEXT416((uint)fVar1));
  auVar8 = vcvtdq2ps_avx(ZEXT416((uint)(int)((auVar8._0_4_ - (pIVar3->Pos).x) + (pIVar3->Scroll).x))
                        );
  (pIVar3->ScrollTarget).x = auVar8._0_4_;
  (pIVar3->ScrollTargetCenterRatio).x = center_x_ratio;
  auVar8._0_12_ = ZEXT812(0);
  auVar8._12_4_ = 0;
  uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar2 - fVar6)),auVar8,2);
  (pIVar3->ScrollTargetEdgeSnapDist).x =
       (float)((uint)!(bool)((byte)uVar4 & 1) * (int)(fVar2 - fVar6));
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = ImMax(window->WindowPadding.x, g.Style.ItemSpacing.x);
    float target_pos_x = ImLerp(g.LastItemData.Rect.Min.x - spacing_x, g.LastItemData.Rect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}